

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void delete_expr(Context_conflict *ctx,MOJOSHADER_astExpression *_expr)

{
  int iVar1;
  MOJOSHADER_astNode *expr;
  MOJOSHADER_astExpression *_expr_local;
  Context_conflict *ctx_local;
  
  if (_expr != (MOJOSHADER_astExpression *)0x0) {
    if ((_expr->ast).type == MOJOSHADER_AST_OP_CAST) {
      delete_expr(ctx,*(MOJOSHADER_astExpression **)&_expr[1].ast);
    }
    else if ((_expr->ast).type == MOJOSHADER_AST_OP_CONSTRUCTOR) {
      delete_arguments(ctx,*(MOJOSHADER_astArguments **)&_expr[1].ast);
    }
    else if ((_expr->ast).type == MOJOSHADER_AST_OP_DEREF_STRUCT) {
      delete_expr(ctx,*(MOJOSHADER_astExpression **)&_expr[1].ast);
    }
    else {
      iVar1 = operator_is_unary((_expr->ast).type);
      if (iVar1 == 0) {
        iVar1 = operator_is_binary((_expr->ast).type);
        if (iVar1 == 0) {
          iVar1 = operator_is_ternary((_expr->ast).type);
          if (iVar1 == 0) {
            if ((_expr->ast).type == MOJOSHADER_AST_OP_CALLFUNC) {
              delete_expr(ctx,*(MOJOSHADER_astExpression **)&_expr[1].ast);
              delete_arguments(ctx,(MOJOSHADER_astArguments *)_expr[1].ast.filename);
            }
          }
          else {
            delete_expr(ctx,*(MOJOSHADER_astExpression **)&_expr[1].ast);
            delete_expr(ctx,(MOJOSHADER_astExpression *)_expr[1].ast.filename);
            delete_expr(ctx,*(MOJOSHADER_astExpression **)&_expr[1].ast.line);
          }
        }
        else {
          delete_expr(ctx,*(MOJOSHADER_astExpression **)&_expr[1].ast);
          delete_expr(ctx,(MOJOSHADER_astExpression *)_expr[1].ast.filename);
        }
      }
      else {
        delete_expr(ctx,*(MOJOSHADER_astExpression **)&_expr[1].ast);
      }
    }
    Free(ctx,_expr);
  }
  return;
}

Assistant:

static void delete_expr(Context *ctx, MOJOSHADER_astExpression *_expr)
{
    MOJOSHADER_astNode *expr = (MOJOSHADER_astNode *) _expr;

    DELETE_AST_NODE(expr);

    if (expr->ast.type == MOJOSHADER_AST_OP_CAST)
        delete_expr(ctx, expr->cast.operand);

    else if (expr->ast.type == MOJOSHADER_AST_OP_CONSTRUCTOR)
        delete_arguments(ctx, expr->constructor.args);

    else if (expr->ast.type == MOJOSHADER_AST_OP_DEREF_STRUCT)
        delete_expr(ctx, expr->derefstruct.identifier);

    else if (operator_is_unary(expr->ast.type))
        delete_expr(ctx, expr->unary.operand);

    else if (operator_is_binary(expr->ast.type))
    {
        delete_expr(ctx, expr->binary.left);
        delete_expr(ctx, expr->binary.right);
    } // else if

    else if (operator_is_ternary(expr->ast.type))
    {
        delete_expr(ctx, expr->ternary.left);
        delete_expr(ctx, expr->ternary.center);
        delete_expr(ctx, expr->ternary.right);
    } // else if

    else if (expr->ast.type == MOJOSHADER_AST_OP_CALLFUNC)
    {
        delete_expr(ctx, (MOJOSHADER_astExpression*)expr->callfunc.identifier);
        delete_arguments(ctx, expr->callfunc.args);
    } // else if

    // rest of operators don't have extra data to free.

    Free(ctx, expr);
}